

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_tec(REF_GRID ref_grid,char *filename)

{
  int faceid;
  uint uVar1;
  FILE *__s;
  long lVar2;
  undefined8 uVar3;
  REF_STATUS RVar4;
  REF_GEOM ref_geom;
  char *pcVar5;
  int iVar6;
  char cVar7;
  REF_INT RVar8;
  int iVar9;
  int iVar10;
  REF_INT *edge_faces;
  REF_INT *local_48;
  REF_GEOM local_40;
  long local_38;
  
  ref_geom = ref_grid->geom;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xdf6,
           "ref_geom_tec","unable to open file");
    RVar4 = 2;
  }
  else {
    fwrite("title=\"refine cad coupling in tecplot format\"\n",0x2e,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"gap\" \"p0\" \"p1\" \"k0\" \"k1\"\n",0x32,1,__s);
    cVar7 = '\x01';
    if ((long)ref_geom->max < 1) {
      iVar10 = -0x80000000;
      iVar6 = 0x7fffffff;
    }
    else {
      iVar10 = -0x80000000;
      iVar6 = 0x7fffffff;
      lVar2 = 0;
      do {
        if (*(int *)((long)ref_geom->descr + lVar2) == 1) {
          iVar9 = *(int *)((long)ref_geom->descr + lVar2 + 4);
          if (iVar9 <= iVar6) {
            iVar6 = iVar9;
          }
          if (iVar10 <= iVar9) {
            iVar10 = iVar9;
          }
        }
        lVar2 = lVar2 + 0x18;
      } while ((long)ref_geom->max * 0x18 != lVar2);
      if (iVar6 <= iVar10) {
        local_38 = CONCAT71(local_38._1_7_,iVar10 < iVar6);
        RVar8 = iVar6;
        local_40 = ref_geom;
        do {
          uVar1 = ref_geom_edge_tec_zone(ref_grid,RVar8,(FILE *)__s);
          if (uVar1 != 0) {
            pcVar5 = "tec edge";
            uVar3 = 0xe05;
            goto LAB_0019615f;
          }
          RVar8 = RVar8 + 1;
        } while (iVar10 + 1 != RVar8);
        ref_geom = local_40;
        cVar7 = (char)local_38;
      }
    }
    if (ref_geom->model != (void *)0x0) {
      uVar1 = ref_egads_edge_faces(ref_geom,&local_48);
      if (uVar1 != 0) {
        pcVar5 = "edge faces";
        uVar3 = 0xe08;
LAB_0019615f:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               uVar3,"ref_geom_tec",(ulong)uVar1,pcVar5);
        return uVar1;
      }
      local_40 = ref_geom;
      if (cVar7 == '\0') {
        iVar9 = iVar6 * 2 + -1;
        do {
          faceid = local_48[iVar9 + -1];
          lVar2 = (long)iVar9;
          RVar8 = local_48[lVar2];
          if (faceid == RVar8) {
            local_38 = lVar2;
            uVar1 = ref_geom_pcrv_tec_zone(ref_grid,iVar6,faceid,1,(FILE *)__s);
            if (uVar1 != 0) {
              pcVar5 = "tec pcrv";
              uVar3 = 0xe0e;
              goto LAB_0019615f;
            }
            uVar1 = ref_geom_pcrv_tec_zone(ref_grid,iVar6,local_48[local_38],-1,(FILE *)__s);
            if (uVar1 != 0) {
              pcVar5 = "tec pcrv";
              uVar3 = 0xe11;
              goto LAB_0019615f;
            }
          }
          else {
            if (faceid != -1) {
              uVar1 = ref_geom_pcrv_tec_zone(ref_grid,iVar6,faceid,0,(FILE *)__s);
              if (uVar1 != 0) {
                pcVar5 = "tec pcrv";
                uVar3 = 0xe16;
                goto LAB_0019615f;
              }
              RVar8 = local_48[lVar2];
            }
            if ((RVar8 != -1) &&
               (uVar1 = ref_geom_pcrv_tec_zone(ref_grid,iVar6,RVar8,0,(FILE *)__s), uVar1 != 0)) {
              pcVar5 = "tec pcrv";
              uVar3 = 0xe1a;
              goto LAB_0019615f;
            }
          }
          iVar6 = iVar6 + 1;
          iVar9 = iVar9 + 2;
        } while (iVar10 + 1 != iVar6);
      }
      ref_geom = local_40;
      if (local_48 != (REF_INT *)0x0) {
        free(local_48);
      }
    }
    if (0 < (long)ref_geom->max) {
      iVar10 = -0x80000000;
      iVar6 = 0x7fffffff;
      lVar2 = 0;
      do {
        if (*(int *)((long)ref_geom->descr + lVar2) == 2) {
          iVar9 = *(int *)((long)ref_geom->descr + lVar2 + 4);
          if (iVar9 <= iVar6) {
            iVar6 = iVar9;
          }
          if (iVar10 <= iVar9) {
            iVar10 = iVar9;
          }
        }
        lVar2 = lVar2 + 0x18;
      } while ((long)ref_geom->max * 0x18 != lVar2);
      if (iVar6 <= iVar10) {
        do {
          uVar1 = ref_geom_face_tec_zone(ref_grid,iVar6,(FILE *)__s);
          if (uVar1 != 0) {
            pcVar5 = "tec face";
            uVar3 = 0xe28;
            goto LAB_0019615f;
          }
          iVar6 = iVar6 + 1;
        } while (iVar10 + 1 != iVar6);
      }
    }
    fclose(__s);
    RVar4 = 0;
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tec(REF_GRID ref_grid, const char *filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *file;
  REF_INT geom, id, min_id, max_id;
  REF_INT *edge_faces;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine cad coupling in tecplot format\"\n");
  fprintf(
      file,
      "variables = \"x\" \"y\" \"z\" \"gap\" \"p0\" \"p1\" \"k0\" \"k1\"\n");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_edge(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_geom_edge_tec_zone(ref_grid, id, file), "tec edge");

  if (ref_geom_model_loaded(ref_geom)) {
    RSS(ref_egads_edge_faces(ref_geom, &edge_faces), "edge faces");
    for (id = min_id; id <= max_id; id++) {
      if (edge_faces[0 + 2 * (id - 1)] ==
          edge_faces[1 + 2 * (id - 1)]) { /* edge used twice by face */
        RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[0 + 2 * (id - 1)],
                                   1, file),
            "tec pcrv");
        RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[1 + 2 * (id - 1)],
                                   -1, file),
            "tec pcrv");
      } else { /* edge used by two faces */
        if (REF_EMPTY != edge_faces[0 + 2 * (id - 1)])
          RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[0 + 2 * (id - 1)],
                                     0, file),
              "tec pcrv");
        if (REF_EMPTY != edge_faces[1 + 2 * (id - 1)])
          RSS(ref_geom_pcrv_tec_zone(ref_grid, id, edge_faces[1 + 2 * (id - 1)],
                                     0, file),
              "tec pcrv");
      }
    }
    ref_free(edge_faces);
  }

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_geom_face_tec_zone(ref_grid, id, file), "tec face");

  fclose(file);
  return REF_SUCCESS;
}